

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_tests.c
# Opt level: O3

void cjson_replace_item_via_pointer_should_replace_items(void)

{
  cJSON_bool cVar1;
  cJSON *item;
  cJSON *item_00;
  cJSON *item_01;
  cJSON *parent;
  cJSON *pcVar2;
  cJSON *pcVar3;
  cJSON *pcVar4;
  long in_FS_OFFSET;
  cJSON replacements [3];
  cJSON local_f8;
  cJSON local_b8;
  cJSON local_78;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  item = (cJSON *)(*global_hooks.allocate)(0x40);
  if (item == (cJSON *)0x0) {
    UnityFail(" Expected Non-NULL",0x123);
  }
  else {
    item->child = (cJSON *)0x0;
    *(undefined8 *)&item->type = 0;
    item->valuedouble = 0.0;
    item->string = (char *)0x0;
    item->valuestring = (char *)0x0;
    *(undefined8 *)&item->valueint = 0;
    item->next = (cJSON *)0x0;
    item->prev = (cJSON *)0x0;
    item->type = 4;
  }
  item_00 = (cJSON *)(*global_hooks.allocate)(0x40);
  if (item_00 == (cJSON *)0x0) {
    UnityFail(" Expected Non-NULL",0x125);
  }
  else {
    item_00->child = (cJSON *)0x0;
    *(undefined8 *)&item_00->type = 0;
    item_00->valuedouble = 0.0;
    item_00->string = (char *)0x0;
    item_00->valuestring = (char *)0x0;
    *(undefined8 *)&item_00->valueint = 0;
    item_00->next = (cJSON *)0x0;
    item_00->prev = (cJSON *)0x0;
    item_00->type = 4;
  }
  item_01 = (cJSON *)(*global_hooks.allocate)(0x40);
  if (item_01 == (cJSON *)0x0) {
    UnityFail(" Expected Non-NULL",0x127);
  }
  else {
    item_01->child = (cJSON *)0x0;
    *(undefined8 *)&item_01->type = 0;
    item_01->valuedouble = 0.0;
    item_01->string = (char *)0x0;
    item_01->valuestring = (char *)0x0;
    *(undefined8 *)&item_01->valueint = 0;
    item_01->next = (cJSON *)0x0;
    item_01->prev = (cJSON *)0x0;
    item_01->type = 4;
  }
  parent = (cJSON *)(*global_hooks.allocate)(0x40);
  if (parent == (cJSON *)0x0) {
    UnityFail(" Expected Non-NULL",0x12a);
    memset(&local_f8,0,0xc0);
  }
  else {
    parent->child = (cJSON *)0x0;
    *(undefined8 *)&parent->type = 0;
    parent->valuedouble = 0.0;
    parent->string = (char *)0x0;
    parent->valuestring = (char *)0x0;
    *(undefined8 *)&parent->valueint = 0;
    parent->next = (cJSON *)0x0;
    parent->prev = (cJSON *)0x0;
    parent->type = 0x20;
    if (item == (cJSON *)0x0) {
      if (item_00 != (cJSON *)0x0) {
        parent->child = item_00;
        pcVar2 = item_00;
        goto LAB_0010603e;
      }
      if (item_01 != (cJSON *)0x0) {
        parent->child = item_01;
      }
    }
    else {
      parent->child = item;
      pcVar2 = item;
      pcVar3 = item;
      if (item_00 != (cJSON *)0x0) {
        do {
          pcVar4 = pcVar3;
          pcVar3 = pcVar4->next;
        } while (pcVar4->next != (cJSON *)0x0);
        pcVar4->next = item_00;
        item_00->prev = pcVar4;
      }
LAB_0010603e:
      if (item_01 != (cJSON *)0x0) {
        do {
          pcVar3 = pcVar2;
          pcVar2 = pcVar3->next;
        } while (pcVar3->next != (cJSON *)0x0);
        pcVar3->next = item_01;
        item_01->prev = pcVar3;
      }
    }
    memset(&local_f8,0,0xc0);
    cVar1 = cJSON_ReplaceItemViaPointer(parent,item,&local_f8);
    if (cVar1 != 0) goto LAB_0010608a;
  }
  UnityFail(" Expected TRUE Was FALSE",0x134);
LAB_0010608a:
  if (local_f8.prev != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0x135);
  }
  if (local_f8.next != item_00) {
    UnityFail(" Expected TRUE Was FALSE",0x136);
  }
  if (item_00->prev != &local_f8) {
    UnityFail(" Expected TRUE Was FALSE",0x137);
  }
  if (parent->child != &local_f8) {
    UnityFail(" Expected TRUE Was FALSE",0x138);
  }
  cVar1 = cJSON_ReplaceItemViaPointer(parent,item_00,&local_b8);
  if (cVar1 == 0) {
    UnityFail(" Expected TRUE Was FALSE",0x13b);
  }
  if (local_b8.prev != &local_f8) {
    UnityFail(" Expected TRUE Was FALSE",0x13c);
  }
  if (local_b8.next != item_01) {
    UnityFail(" Expected TRUE Was FALSE",0x13d);
  }
  if (item_01->prev != &local_b8) {
    UnityFail(" Expected TRUE Was FALSE",0x13e);
  }
  cVar1 = cJSON_ReplaceItemViaPointer(parent,item_01,&local_78);
  if (cVar1 == 0) {
    UnityFail(" Expected TRUE Was FALSE",0x141);
  }
  if (local_78.prev != &local_b8) {
    UnityFail(" Expected TRUE Was FALSE",0x142);
  }
  if (local_78.next != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0x143);
  }
  if (local_b8.next != &local_78) {
    UnityFail(" Expected TRUE Was FALSE",0x144);
  }
  (*global_hooks.deallocate)(parent);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void cjson_replace_item_via_pointer_should_replace_items(void)
{
    cJSON replacements[3];
    cJSON *beginning = NULL;
    cJSON *middle = NULL;
    cJSON *end = NULL;
    cJSON *array = NULL;

    beginning = cJSON_CreateNull();
    TEST_ASSERT_NOT_NULL(beginning);
    middle = cJSON_CreateNull();
    TEST_ASSERT_NOT_NULL(middle);
    end = cJSON_CreateNull();
    TEST_ASSERT_NOT_NULL(end);

    array = cJSON_CreateArray();
    TEST_ASSERT_NOT_NULL(array);

    cJSON_AddItemToArray(array, beginning);
    cJSON_AddItemToArray(array, middle);
    cJSON_AddItemToArray(array, end);


    memset(replacements, '\0', sizeof(replacements));

    /* replace beginning */
    TEST_ASSERT_TRUE(cJSON_ReplaceItemViaPointer(array, beginning, &(replacements[0])));
    TEST_ASSERT_NULL(replacements[0].prev);
    TEST_ASSERT_TRUE(replacements[0].next == middle);
    TEST_ASSERT_TRUE(middle->prev == &(replacements[0]));
    TEST_ASSERT_TRUE(array->child == &(replacements[0]));

    /* replace middle */
    TEST_ASSERT_TRUE(cJSON_ReplaceItemViaPointer(array, middle, &(replacements[1])));
    TEST_ASSERT_TRUE(replacements[1].prev == &(replacements[0]));
    TEST_ASSERT_TRUE(replacements[1].next == end);
    TEST_ASSERT_TRUE(end->prev == &(replacements[1]));

    /* replace end */
    TEST_ASSERT_TRUE(cJSON_ReplaceItemViaPointer(array, end, &(replacements[2])));
    TEST_ASSERT_TRUE(replacements[2].prev == &(replacements[1]));
    TEST_ASSERT_NULL(replacements[2].next);
    TEST_ASSERT_TRUE(replacements[1].next == &(replacements[2]));

    cJSON_free(array);
}